

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_striped_sse2_128_64.c
# Opt level: O2

parasail_result_t *
parasail_sw_stats_striped_profile_sse2_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  undefined1 (*pauVar1) [16];
  long *plVar2;
  undefined8 *puVar3;
  ulong *puVar4;
  uint *puVar5;
  int iVar6;
  parasail_matrix_t *ppVar7;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined4 uVar24;
  undefined8 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  parasail_result_t *result;
  parasail_profile_t *profile_00;
  parasail_result_t *result_00;
  __m128i *palVar32;
  __m128i *palVar33;
  __m128i *palVar34;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *palVar35;
  __m128i *palVar36;
  ulong uVar37;
  __m128i *palVar38;
  ulong uVar39;
  size_t len;
  ulong uVar40;
  char *pcVar41;
  longlong lVar42;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  long extraout_RDX_06;
  long lVar43;
  void *pvVar44;
  int iVar45;
  ulong uVar46;
  char *__format;
  __m128i *palVar47;
  longlong lVar48;
  uint uVar49;
  longlong lVar50;
  __m128i *palVar51;
  ulong uVar52;
  ulong uVar53;
  long lVar54;
  long lVar55;
  bool bVar56;
  uint uVar57;
  ulong uVar58;
  ulong extraout_XMM0_Qa_06;
  uint uVar68;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  ulong extraout_XMM0_Qa_01;
  ulong extraout_XMM0_Qb_01;
  undefined1 auVar64 [16];
  ulong extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  ulong extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  undefined1 extraout_XMM0_01 [16];
  undefined1 auVar67 [16];
  ulong extraout_XMM0_Qb_06;
  undefined1 extraout_XMM0_02 [16];
  undefined1 extraout_XMM0_03 [16];
  __m128i_64_t B_1;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  int iVar80;
  long lVar81;
  int iVar92;
  longlong lVar93;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  int iVar91;
  int iVar94;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  ulong uVar102;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  int iVar103;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  uint uVar105;
  ulong uVar106;
  uint uVar109;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  ulong uVar110;
  ulong uVar111;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  ulong uVar115;
  ulong uVar116;
  ulong uVar117;
  __m128i_64_t B;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  ulong uVar120;
  long lVar121;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  long lVar125;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  __m128i a_08;
  __m128i a_09;
  __m128i a_10;
  __m128i a_11;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i b_08;
  __m128i b_09;
  __m128i b_10;
  __m128i b_11;
  __m128i b_12;
  __m128i b_13;
  __m128i b_14;
  __m128i b_15;
  __m128i alVar128;
  undefined1 local_2d8 [16];
  __m128i *local_2c0;
  undefined1 local_2b8 [16];
  __m128i *local_2a8;
  __m128i *local_2a0;
  __m128i *local_298;
  __m128i *local_288;
  __m128i *local_280;
  __m128i *local_278;
  __m128i *local_270;
  __m128i *local_268;
  undefined1 local_258 [16];
  ulong local_230;
  __m128i *local_228;
  undefined1 local_1f8 [16];
  ulong local_1a8;
  ulong uStack_1a0;
  long local_160;
  ulong local_138;
  ulong uStack_130;
  ulong local_128;
  ulong uStack_120;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 uStack_e0;
  long local_d8;
  long lStack_d0;
  ulong uStack_c0;
  ulong uStack_40;
  int iVar104;
  
  pcVar41 = profile->s1;
  ppVar7 = profile->matrix;
  result = parasail_sw_striped_profile_sse2_128_64(profile,s2,s2Len,open,gap);
  iVar29 = parasail_result_is_saturated(result);
  if (iVar29 != 0) {
    return result;
  }
  iVar29 = result->end_query;
  iVar6 = result->end_ref;
  profile_00 = parasail_profile_create_stats_sse_128_64(pcVar41,iVar29 + 1,ppVar7);
  if (profile_00 == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar41 = "profile";
  }
  else {
    pvVar8 = (profile_00->profile64).score;
    if (pvVar8 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar41 = "profile->profile64.score";
    }
    else {
      ppVar7 = profile_00->matrix;
      if (ppVar7 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar41 = "profile->matrix";
      }
      else {
        uVar39 = (ulong)(uint)profile_00->s1Len;
        if (profile_00->s1Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar41 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar41 = "s2";
        }
        else if (iVar6 < 0) {
          __format = "%s: %s must be > 0\n";
          pcVar41 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar41 = "open";
        }
        else {
          if (-1 < gap) {
            pvVar9 = (profile_00->profile64).matches;
            pvVar10 = (profile_00->profile64).similar;
            iVar31 = ppVar7->max;
            result_00 = parasail_result_new_stats();
            if (result_00 == (parasail_result_t *)0x0) {
              result_00 = (parasail_result_t *)0x0;
            }
            else {
              uVar52 = uVar39 + 1 >> 1;
              result_00->flag = result_00->flag | 0x2810804;
              palVar32 = parasail_memalign___m128i(0x10,uVar52);
              local_2c0 = parasail_memalign___m128i(0x10,uVar52);
              palVar33 = parasail_memalign___m128i(0x10,uVar52);
              local_2a8 = parasail_memalign___m128i(0x10,uVar52);
              palVar34 = parasail_memalign___m128i(0x10,uVar52);
              local_2a0 = parasail_memalign___m128i(0x10,uVar52);
              local_298 = parasail_memalign___m128i(0x10,uVar52);
              local_2d8._0_8_ = parasail_memalign___m128i(0x10,uVar52);
              b = parasail_memalign___m128i(0x10,uVar52);
              b_00 = parasail_memalign___m128i(0x10,uVar52);
              b_01 = parasail_memalign___m128i(0x10,uVar52);
              b_02 = parasail_memalign___m128i(0x10,uVar52);
              palVar35 = parasail_memalign___m128i(0x10,uVar52);
              palVar36 = parasail_memalign___m128i(0x10,uVar52);
              local_228 = parasail_memalign___m128i(0x10,uVar52);
              local_268 = parasail_memalign___m128i(0x10,uVar52);
              auVar126._0_4_ = -(uint)((int)palVar32 == 0);
              auVar126._4_4_ = -(uint)((int)((ulong)palVar32 >> 0x20) == 0);
              auVar126._8_4_ = -(uint)((int)local_2c0 == 0);
              auVar126._12_4_ = -(uint)((int)((ulong)local_2c0 >> 0x20) == 0);
              auVar59._4_4_ = auVar126._0_4_;
              auVar59._0_4_ = auVar126._4_4_;
              auVar59._8_4_ = auVar126._12_4_;
              auVar59._12_4_ = auVar126._8_4_;
              auVar122._0_4_ = -(uint)((int)palVar33 == 0);
              auVar122._4_4_ = -(uint)((int)((ulong)palVar33 >> 0x20) == 0);
              auVar122._8_4_ = -(uint)((int)local_2a8 == 0);
              auVar122._12_4_ = -(uint)((int)((ulong)local_2a8 >> 0x20) == 0);
              auVar127._4_4_ = auVar122._0_4_;
              auVar127._0_4_ = auVar122._4_4_;
              auVar127._8_4_ = auVar122._12_4_;
              auVar127._12_4_ = auVar122._8_4_;
              auVar59 = packssdw(auVar59 & auVar126,auVar127 & auVar122);
              auVar118._0_4_ = -(uint)((int)palVar34 == 0);
              auVar118._4_4_ = -(uint)((int)((ulong)palVar34 >> 0x20) == 0);
              auVar118._8_4_ = -(uint)((int)local_2a0 == 0);
              auVar118._12_4_ = -(uint)((int)((ulong)local_2a0 >> 0x20) == 0);
              auVar123._4_4_ = auVar118._0_4_;
              auVar123._0_4_ = auVar118._4_4_;
              auVar123._8_4_ = auVar118._12_4_;
              auVar123._12_4_ = auVar118._8_4_;
              auVar112._0_4_ = -(uint)((int)local_298 == 0);
              auVar112._4_4_ = -(uint)((int)((ulong)local_298 >> 0x20) == 0);
              auVar112._8_4_ = -(uint)((int)local_2d8._0_8_ == 0);
              auVar112._12_4_ = -(uint)((int)((ulong)local_2d8._0_8_ >> 0x20) == 0);
              auVar119._4_4_ = auVar112._0_4_;
              auVar119._0_4_ = auVar112._4_4_;
              auVar119._8_4_ = auVar112._12_4_;
              auVar119._12_4_ = auVar112._8_4_;
              auVar124 = packssdw(auVar123 & auVar118,auVar119 & auVar112);
              auVar59 = packssdw(auVar59,auVar124);
              auVar84._0_4_ = -(uint)((int)b == 0);
              auVar84._4_4_ = -(uint)((int)((ulong)b >> 0x20) == 0);
              auVar84._8_4_ = -(uint)((int)b_00 == 0);
              auVar84._12_4_ = -(uint)((int)((ulong)b_00 >> 0x20) == 0);
              auVar113._4_4_ = auVar84._0_4_;
              auVar113._0_4_ = auVar84._4_4_;
              auVar113._8_4_ = auVar84._12_4_;
              auVar113._12_4_ = auVar84._8_4_;
              auVar114._0_4_ = -(uint)((int)b_01 == 0);
              auVar114._4_4_ = -(uint)((int)((ulong)b_01 >> 0x20) == 0);
              auVar114._8_4_ = -(uint)((int)b_02 == 0);
              auVar114._12_4_ = -(uint)((int)((ulong)b_02 >> 0x20) == 0);
              auVar107._4_4_ = auVar114._0_4_;
              auVar107._0_4_ = auVar114._4_4_;
              auVar107._8_4_ = auVar114._12_4_;
              auVar107._12_4_ = auVar114._8_4_;
              auVar114 = packssdw(auVar113 & auVar84,auVar107 & auVar114);
              auVar72._0_4_ = -(uint)((int)palVar35 == 0);
              auVar72._4_4_ = -(uint)((int)((ulong)palVar35 >> 0x20) == 0);
              auVar72._8_4_ = -(uint)((int)palVar36 == 0);
              auVar72._12_4_ = -(uint)((int)((ulong)palVar36 >> 0x20) == 0);
              auVar70._4_4_ = auVar72._0_4_;
              auVar70._0_4_ = auVar72._4_4_;
              auVar70._8_4_ = auVar72._12_4_;
              auVar70._12_4_ = auVar72._8_4_;
              auVar124._0_4_ = -(uint)((int)local_228 == 0);
              auVar124._4_4_ = -(uint)((int)((ulong)local_228 >> 0x20) == 0);
              auVar124._8_4_ = -(uint)((int)local_268 == 0);
              auVar124._12_4_ = -(uint)((int)((ulong)local_268 >> 0x20) == 0);
              auVar74._4_4_ = auVar124._0_4_;
              auVar74._0_4_ = auVar124._4_4_;
              auVar74._8_4_ = auVar124._12_4_;
              auVar74._12_4_ = auVar124._8_4_;
              auVar124 = packssdw(auVar70 & auVar72,auVar74 & auVar124);
              auVar124 = packssdw(auVar114,auVar124);
              auVar59 = packsswb(auVar59,auVar124);
              if ((((((((((((((((auVar59 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar59 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar59 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar59 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar59 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar59 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar59 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar59 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar59 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar59 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar59 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar59 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar59 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar59 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar59 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar59[0xf]) {
                len = 0x7fffffffffffffff;
                uVar58 = (ulong)(uint)gap;
                alVar128[1] = local_2d8._0_8_;
                alVar128[0] = uVar52;
                parasail_memset___m128i(palVar32,alVar128,0x7fffffffffffffff);
                c[1] = extraout_RDX;
                c[0] = uVar52;
                parasail_memset___m128i(palVar33,c,len);
                c_00[1] = extraout_RDX_00;
                c_00[0] = uVar52;
                parasail_memset___m128i(palVar34,c_00,len);
                c_01[1] = extraout_RDX_01;
                c_01[0] = uVar52;
                parasail_memset___m128i(local_298,c_01,len);
                c_02[1] = extraout_RDX_02;
                c_02[0] = uVar52;
                parasail_memset___m128i(b,c_02,len);
                c_03[1] = extraout_RDX_03;
                c_03[0] = uVar52;
                parasail_memset___m128i(b_00,c_03,len);
                c_04[1] = extraout_RDX_04;
                c_04[0] = uVar52;
                parasail_memset___m128i(b_01,c_04,len);
                c_05[1] = extraout_RDX_05;
                c_05[0] = uVar52;
                palVar47 = b_02;
                parasail_memset___m128i(b_02,c_05,len);
                uVar11 = (uint)uVar52;
                uVar37 = (ulong)(uVar11 - 1);
                local_1f8._0_8_ = 0;
                local_1f8._8_8_ = 0;
                local_160 = -0x4000000000000000;
                uVar53 = 0;
                lVar55 = extraout_RDX_06;
                for (local_230 = 0; local_270 = palVar32, local_278 = palVar33, local_280 = palVar34
                    , iVar45 = (int)uVar53, uVar46 = local_230, local_230 != iVar6 + 1U;
                    local_230 = local_230 + 1) {
                  lVar48 = local_270[uVar37][0];
                  lVar50 = local_278[uVar37][0];
                  lVar42 = local_280[uVar37][0];
                  lVar93 = local_298[uVar37][0];
                  lVar55 = 0;
                  uVar40 = (ulong)(byte)s2[local_230];
                  lVar43 = (long)(int)(ppVar7->mapper[uVar40] * uVar11) * 0x10;
                  pvVar44 = (void *)(lVar43 + (long)pvVar10);
                  iVar30 = (int)local_230 + -2;
                  bVar56 = iVar45 == iVar30;
                  palVar38 = local_268;
                  if (bVar56) {
                    palVar38 = (__m128i *)local_2d8._0_8_;
                  }
                  lVar125 = 0;
                  local_288 = (__m128i *)local_2d8._0_8_;
                  if (bVar56) {
                    local_288 = local_268;
                  }
                  lVar121 = 0;
                  palVar34 = local_2a0;
                  if (bVar56) {
                    palVar34 = local_228;
                  }
                  lVar81 = 0;
                  palVar32 = local_2c0;
                  palVar33 = local_2a8;
                  if (bVar56) {
                    palVar32 = palVar35;
                    palVar33 = palVar36;
                  }
                  local_2d8 = (undefined1  [16])0x0;
                  lVar54 = 0;
                  uVar106 = 0;
                  uVar116 = 0;
                  uVar120 = 0;
                  uVar102 = 0;
                  uVar111 = 1;
                  uVar115 = 1;
                  b_13[0] = pvVar44;
                  palVar47 = (__m128i *)(uVar37 * 0x10);
                  while( true ) {
                    uStack_40 = (ulong)(uint)open;
                    uStack_c0 = (ulong)(uint)gap;
                    if (uVar52 << 4 == lVar54) break;
                    auVar59 = *(undefined1 (*) [16])((long)*b + lVar54);
                    pauVar1 = (undefined1 (*) [16])((long)*b_00 + lVar54);
                    uVar117 = *(ulong *)*pauVar1;
                    uVar13 = *(ulong *)(*pauVar1 + 8);
                    auVar124 = *pauVar1;
                    pauVar1 = (undefined1 (*) [16])((long)*b_01 + lVar54);
                    uVar14 = *(ulong *)*pauVar1;
                    uVar15 = *(ulong *)(*pauVar1 + 8);
                    auVar72 = *pauVar1;
                    plVar2 = (long *)((long)pvVar8 + lVar54 + lVar43);
                    auVar83._0_8_ = lVar55 + *plVar2;
                    auVar83._8_8_ = lVar48 + plVar2[1];
                    pauVar1 = (undefined1 (*) [16])((long)*b_02 + lVar54);
                    lVar55 = *(long *)*pauVar1;
                    lVar16 = *(long *)(*pauVar1 + 8);
                    auVar74 = *pauVar1;
                    auVar114 = auVar83 ^ _DAT_008a1890;
                    iVar80 = -(uint)((int)DAT_008a1890 < auVar114._0_4_);
                    auVar82._4_4_ = -(uint)(DAT_008a1890._4_4_ < auVar114._4_4_);
                    iVar92 = -(uint)(DAT_008a1890._8_4_ < auVar114._8_4_);
                    auVar82._12_4_ = -(uint)(DAT_008a1890._12_4_ < auVar114._12_4_);
                    auVar95._4_4_ = iVar80;
                    auVar95._0_4_ = iVar80;
                    auVar95._8_4_ = iVar92;
                    auVar95._12_4_ = iVar92;
                    auVar69._4_4_ = -(uint)(auVar114._4_4_ == DAT_008a1890._4_4_);
                    auVar69._12_4_ = -(uint)(auVar114._12_4_ == DAT_008a1890._12_4_);
                    auVar69._0_4_ = auVar69._4_4_;
                    auVar69._8_4_ = auVar69._12_4_;
                    auVar82._0_4_ = auVar82._4_4_;
                    auVar82._8_4_ = auVar82._12_4_;
                    auVar83 = (auVar82 | auVar69 & auVar95) & auVar83;
                    auVar114 = auVar83 ^ _DAT_008a1890;
                    auVar70 = auVar59 ^ _DAT_008a1890;
                    iVar80 = -(uint)(auVar70._0_4_ < auVar114._0_4_);
                    iVar91 = -(uint)(auVar70._4_4_ < auVar114._4_4_);
                    iVar92 = -(uint)(auVar70._8_4_ < auVar114._8_4_);
                    iVar94 = -(uint)(auVar70._12_4_ < auVar114._12_4_);
                    auVar96._4_4_ = iVar80;
                    auVar96._0_4_ = iVar80;
                    auVar96._8_4_ = iVar92;
                    auVar96._12_4_ = iVar92;
                    iVar80 = -(uint)(auVar70._4_4_ == auVar114._4_4_);
                    iVar92 = -(uint)(auVar70._12_4_ == auVar114._12_4_);
                    auVar60._4_4_ = iVar80;
                    auVar60._0_4_ = iVar80;
                    auVar60._8_4_ = iVar92;
                    auVar60._12_4_ = iVar92;
                    auVar71._4_4_ = iVar91;
                    auVar71._0_4_ = iVar91;
                    auVar71._8_4_ = iVar94;
                    auVar71._12_4_ = iVar94;
                    auVar71 = auVar71 | auVar60 & auVar96;
                    auVar70 = ~auVar71 & auVar59 | auVar83 & auVar71;
                    auVar114 = auVar70 ^ _DAT_008a1890;
                    auVar84 = local_2d8 ^ _DAT_008a1890;
                    iVar80 = -(uint)(auVar84._0_4_ < auVar114._0_4_);
                    iVar92 = -(uint)(auVar84._4_4_ < auVar114._4_4_);
                    iVar91 = -(uint)(auVar84._8_4_ < auVar114._8_4_);
                    iVar94 = -(uint)(auVar84._12_4_ < auVar114._12_4_);
                    auVar108._4_4_ = iVar80;
                    auVar108._0_4_ = iVar80;
                    auVar108._8_4_ = iVar91;
                    auVar108._12_4_ = iVar91;
                    auVar85._4_4_ = -(uint)(auVar84._4_4_ == auVar114._4_4_);
                    auVar85._12_4_ = -(uint)(auVar84._12_4_ == auVar114._12_4_);
                    auVar85._0_4_ = auVar85._4_4_;
                    auVar85._8_4_ = auVar85._12_4_;
                    auVar61._4_4_ = iVar92;
                    auVar61._0_4_ = iVar92;
                    auVar61._8_4_ = iVar94;
                    auVar61._12_4_ = iVar94;
                    auVar61 = auVar61 | auVar85 & auVar108;
                    auVar114 = ~auVar61 & local_2d8 | auVar70 & auVar61;
                    *(undefined1 (*) [16])((long)*palVar32 + lVar54) = auVar114;
                    a[1] = uVar46;
                    a[0] = (longlong)palVar47;
                    b_03[1] = uVar40;
                    b_03[0] = (longlong)b_13[0];
                    alVar128 = _mm_cmpeq_epi64_rpl(a,b_03);
                    b_04[0] = alVar128[1];
                    local_258._8_8_ = extraout_XMM0_Qb;
                    local_258._0_8_ = extraout_XMM0_Qa;
                    a_00[1] = uVar46;
                    a_00[0] = (longlong)palVar47;
                    b_04[1] = uVar40;
                    alVar128 = _mm_cmpeq_epi64_rpl(a_00,b_04);
                    b_05[0] = alVar128[1];
                    local_f8._8_8_ = extraout_XMM0_Qb_00;
                    local_f8._0_8_ = extraout_XMM0_Qa_00;
                    a_01[1] = uVar46;
                    a_01[0] = (longlong)palVar47;
                    b_05[1] = uVar40;
                    alVar128 = _mm_cmpeq_epi64_rpl(a_01,b_05);
                    b_06[0] = alVar128[1];
                    auVar21._8_8_ = uVar116;
                    auVar21._0_8_ = uVar106;
                    plVar2 = (long *)((long)pvVar9 + lVar54 + lVar43);
                    auVar97._0_8_ = lVar125 + *plVar2;
                    auVar97._8_8_ = lVar50 + plVar2[1];
                    auVar70 = ~local_258 &
                              (auVar97 & local_f8 |
                              ~local_f8 & (extraout_XMM0 & auVar21 | ~extraout_XMM0 & auVar124));
                    *(undefined1 (*) [16])((long)*palVar33 + lVar54) = auVar70;
                    auVar17._8_8_ = uVar102;
                    auVar17._0_8_ = uVar120;
                    plVar2 = (long *)((long)pvVar44 + lVar54);
                    auVar98._0_8_ = lVar121 + *plVar2;
                    auVar98._8_8_ = lVar42 + plVar2[1];
                    auVar72 = ~local_258 &
                              (auVar98 & local_f8 |
                              ~local_f8 & (extraout_XMM0 & auVar17 | ~extraout_XMM0 & auVar72));
                    auVar19._8_8_ = uVar115;
                    auVar19._0_8_ = uVar111;
                    auVar73._8_4_ = 0xffffffff;
                    auVar73._0_8_ = 0xffffffffffffffff;
                    auVar73._12_4_ = 0xffffffff;
                    auVar86._0_8_ = lVar81 + 1;
                    auVar86._8_8_ = lVar93 - auVar73._8_8_;
                    auVar84 = ~local_258 &
                              (auVar86 & local_f8 |
                              ~local_f8 & (extraout_XMM0 & auVar19 | ~extraout_XMM0 & auVar74));
                    auVar124 = auVar114 ^ _DAT_008a1890;
                    auVar74 = local_1f8 ^ _DAT_008a1890;
                    iVar80 = -(uint)(auVar74._0_4_ < auVar124._0_4_);
                    iVar91 = -(uint)(auVar74._4_4_ < auVar124._4_4_);
                    iVar92 = -(uint)(auVar74._8_4_ < auVar124._8_4_);
                    iVar94 = -(uint)(auVar74._12_4_ < auVar124._12_4_);
                    auVar99._4_4_ = iVar80;
                    auVar99._0_4_ = iVar80;
                    auVar99._8_4_ = iVar92;
                    auVar99._12_4_ = iVar92;
                    iVar80 = -(uint)(auVar74._4_4_ == auVar124._4_4_);
                    iVar92 = -(uint)(auVar74._12_4_ == auVar124._12_4_);
                    auVar62._4_4_ = iVar80;
                    auVar62._0_4_ = iVar80;
                    auVar62._8_4_ = iVar92;
                    auVar62._12_4_ = iVar92;
                    auVar75._4_4_ = iVar91;
                    auVar75._0_4_ = iVar91;
                    auVar75._8_4_ = iVar94;
                    auVar75._12_4_ = iVar94;
                    auVar75 = auVar75 | auVar62 & auVar99;
                    local_1f8 = ~auVar75 & local_1f8 | auVar114 & auVar75;
                    auVar87._0_8_ = auVar114._0_8_ - (ulong)(uint)open;
                    auVar87._8_8_ = auVar114._8_8_ - uStack_40;
                    local_d8 = auVar59._0_8_;
                    lStack_d0 = auVar59._8_8_;
                    auVar76._0_8_ = local_d8 - uVar58;
                    auVar76._8_8_ = lStack_d0 - uStack_c0;
                    auVar59 = auVar76 ^ _DAT_008a1890;
                    auVar124 = auVar87 ^ _DAT_008a1890;
                    iVar80 = -(uint)(auVar59._0_4_ < auVar124._0_4_);
                    iVar91 = auVar124._4_4_;
                    iVar92 = -(uint)(auVar59._4_4_ < iVar91);
                    iVar104 = auVar124._12_4_;
                    iVar94 = -(uint)(auVar59._8_4_ < auVar124._8_4_);
                    iVar103 = -(uint)(auVar59._12_4_ < iVar104);
                    auVar88._4_4_ = iVar80;
                    auVar88._0_4_ = iVar80;
                    auVar88._8_4_ = iVar94;
                    auVar88._12_4_ = iVar94;
                    auVar63._4_4_ = -(uint)(auVar59._4_4_ == iVar91);
                    auVar63._12_4_ = -(uint)(auVar59._12_4_ == iVar104);
                    auVar63._0_4_ = auVar63._4_4_;
                    auVar63._8_4_ = auVar63._12_4_;
                    auVar89._4_4_ = iVar92;
                    auVar89._0_4_ = iVar92;
                    auVar89._8_4_ = iVar103;
                    auVar89._12_4_ = iVar103;
                    auVar89 = auVar89 | auVar63 & auVar88;
                    auVar59 = ~auVar89 & auVar76 | auVar87 & auVar89;
                    *(undefined1 (*) [16])((long)*palVar34 + lVar54) = auVar72;
                    *(undefined1 (*) [16])((long)*local_288 + lVar54) = auVar84;
                    a_02[1] = uVar46;
                    a_02[0] = (longlong)palVar47;
                    b_06[1] = uVar40;
                    alVar128 = _mm_cmpgt_epi64_rpl(a_02,b_06);
                    b_07[0] = alVar128[1];
                    local_1a8 = auVar70._0_8_;
                    uStack_1a0 = auVar70._8_8_;
                    local_138 = auVar72._0_8_;
                    uStack_130 = auVar72._8_8_;
                    auVar77._8_4_ = 0xffffffff;
                    auVar77._0_8_ = 0xffffffffffffffff;
                    auVar77._12_4_ = 0xffffffff;
                    local_258._0_8_ = auVar84._0_8_;
                    local_258._8_8_ = auVar84._8_8_;
                    uVar110 = local_258._8_8_ - auVar77._8_8_;
                    local_e8 = auVar59._0_8_;
                    uStack_e0 = auVar59._8_8_;
                    puVar3 = (undefined8 *)((long)*b + lVar54);
                    *puVar3 = local_e8;
                    puVar3[1] = uStack_e0;
                    puVar4 = (ulong *)((long)*b_00 + lVar54);
                    *puVar4 = extraout_XMM0_Qa_01 & local_1a8 | ~extraout_XMM0_Qa_01 & uVar117;
                    puVar4[1] = extraout_XMM0_Qb_01 & uStack_1a0 | ~extraout_XMM0_Qb_01 & uVar13;
                    puVar4 = (ulong *)((long)*b_01 + lVar54);
                    *puVar4 = local_138 & extraout_XMM0_Qa_01 | ~extraout_XMM0_Qa_01 & uVar14;
                    puVar4[1] = uStack_130 & extraout_XMM0_Qb_01 | ~extraout_XMM0_Qb_01 & uVar15;
                    puVar4 = (ulong *)((long)*b_02 + lVar54);
                    *puVar4 = extraout_XMM0_Qa_01 & local_258._0_8_ + 1 |
                              ~extraout_XMM0_Qa_01 & lVar55 + 1U;
                    puVar4[1] = extraout_XMM0_Qb_01 & uVar110 |
                                ~extraout_XMM0_Qb_01 & lVar16 - auVar77._8_8_;
                    auVar78._0_8_ = local_2d8._0_8_ - uVar58;
                    auVar78._8_8_ = local_2d8._8_8_ - uStack_c0;
                    auVar59 = auVar78 ^ _DAT_008a1890;
                    iVar80 = -(uint)(auVar59._0_4_ < auVar124._0_4_);
                    auVar100._4_4_ = -(uint)(auVar59._4_4_ < iVar91);
                    iVar92 = -(uint)(auVar59._8_4_ < auVar124._8_4_);
                    auVar100._12_4_ = -(uint)(auVar59._12_4_ < iVar104);
                    auVar90._4_4_ = iVar80;
                    auVar90._0_4_ = iVar80;
                    auVar90._8_4_ = iVar92;
                    auVar90._12_4_ = iVar92;
                    auVar64._4_4_ = -(uint)(auVar59._4_4_ == iVar91);
                    auVar64._12_4_ = -(uint)(auVar59._12_4_ == iVar104);
                    auVar64._0_4_ = auVar64._4_4_;
                    auVar64._8_4_ = auVar64._12_4_;
                    auVar100._0_4_ = auVar100._4_4_;
                    auVar100._8_4_ = auVar100._12_4_;
                    auVar100 = auVar100 | auVar64 & auVar90;
                    local_2d8 = ~auVar100 & auVar78 | auVar87 & auVar100;
                    a_03[1] = uVar46;
                    a_03[0] = (longlong)palVar47;
                    b_07[1] = uVar40;
                    alVar128 = _mm_cmpgt_epi64_rpl(a_03,b_07);
                    b_13[0] = alVar128[1];
                    uVar106 = local_1a8 & extraout_XMM0_Qa_02 | ~extraout_XMM0_Qa_02 & uVar106;
                    uVar116 = uStack_1a0 & extraout_XMM0_Qb_02 | ~extraout_XMM0_Qb_02 & uVar116;
                    uVar120 = local_138 & extraout_XMM0_Qa_02 | ~extraout_XMM0_Qa_02 & uVar120;
                    uVar102 = uStack_130 & extraout_XMM0_Qb_02 | ~extraout_XMM0_Qb_02 & uVar102;
                    uVar111 = local_258._0_8_ + 1 & extraout_XMM0_Qa_02 |
                              ~extraout_XMM0_Qa_02 & uVar111 + 1;
                    uVar115 = uVar110 & extraout_XMM0_Qb_02 | ~extraout_XMM0_Qb_02 & uVar115 + 1;
                    plVar2 = (long *)((long)*local_270 + lVar54);
                    lVar55 = *plVar2;
                    lVar48 = plVar2[1];
                    plVar2 = (long *)((long)*local_278 + lVar54);
                    lVar125 = *plVar2;
                    lVar50 = plVar2[1];
                    plVar2 = (long *)((long)*local_280 + lVar54);
                    lVar121 = *plVar2;
                    lVar42 = plVar2[1];
                    plVar2 = (long *)((long)*local_298 + lVar54);
                    lVar81 = *plVar2;
                    lVar93 = plVar2[1];
                    lVar54 = lVar54 + 0x10;
                  }
                  if (iVar45 == iVar30) {
                    palVar35 = local_2c0;
                    palVar36 = local_2a8;
                    local_228 = local_2a0;
                  }
                  for (iVar30 = 0; iVar30 != 2; iVar30 = iVar30 + 1) {
                    uVar117 = 0;
                    local_2d8._8_8_ = local_2d8._0_8_;
                    local_2d8._0_8_ = (long)-open;
                    uVar102 = 1;
                    uVar116 = uVar111;
                    uVar106 = 0;
                    uVar115 = uVar106;
                    for (lVar55 = 0; uVar111 = uVar102, uVar52 << 4 != lVar55;
                        lVar55 = lVar55 + 0x10) {
                      puVar5 = (uint *)((long)*palVar32 + lVar55);
                      uVar49 = puVar5[1];
                      uVar12 = puVar5[3];
                      uVar24 = local_2d8._0_4_;
                      uVar26 = local_2d8._4_4_;
                      uVar27 = local_2d8._8_4_;
                      uVar28 = local_2d8._12_4_;
                      uVar105 = -(uint)((int)(uVar24 ^ 0x80000000) < (int)(*puVar5 ^ 0x80000000));
                      uVar109 = -(uint)((int)(uVar27 ^ 0x80000000) < (int)(puVar5[2] ^ 0x80000000));
                      uVar57 = -(uint)((int)uVar26 < (int)uVar49) |
                               -(uint)(uVar49 == uVar26) & uVar105;
                      uVar105 = -(uint)((int)uVar26 < (int)uVar49) |
                                -(uint)(uVar49 == uVar26) & uVar105;
                      uVar68 = -(uint)((int)uVar28 < (int)uVar12) |
                               -(uint)(uVar12 == uVar28) & uVar109;
                      uVar109 = -(uint)((int)uVar28 < (int)uVar12) |
                                -(uint)(uVar12 == uVar28) & uVar109;
                      local_2b8._0_4_ = ~uVar57 & uVar24 | *puVar5 & uVar57;
                      local_2b8._4_4_ = ~uVar105 & uVar26 | uVar49 & uVar105;
                      local_2b8._8_4_ = ~uVar68 & uVar27 | puVar5[2] & uVar68;
                      local_2b8._12_4_ = ~uVar109 & uVar28 | uVar12 & uVar109;
                      puVar5 = (uint *)((long)*palVar32 + lVar55);
                      *puVar5 = local_2b8._0_4_;
                      puVar5[1] = local_2b8._4_4_;
                      puVar5[2] = local_2b8._8_4_;
                      puVar5[3] = local_2b8._12_4_;
                      a_04[1] = uVar46;
                      a_04[0] = (longlong)palVar47;
                      b_08[1] = uVar40;
                      b_08[0] = (longlong)b_13[0];
                      alVar128 = _mm_cmpeq_epi64_rpl(a_04,b_08);
                      b_09[0] = alVar128[1];
                      local_258._8_8_ = extraout_XMM0_Qb_03;
                      local_258._0_8_ = extraout_XMM0_Qa_03;
                      a_05[1] = uVar46;
                      a_05[0] = (longlong)palVar47;
                      b_09[1] = uVar40;
                      alVar128 = _mm_cmpeq_epi64_rpl(a_05,b_09);
                      b_10[0] = alVar128[1];
                      auVar59 = ~local_258 & extraout_XMM0_00;
                      auVar22._8_8_ = uVar115;
                      auVar22._0_8_ = uVar106;
                      auVar72 = auVar59 & auVar22 |
                                ~auVar59 & *(undefined1 (*) [16])((long)*palVar33 + lVar55);
                      *(undefined1 (*) [16])((long)*palVar33 + lVar55) = auVar72;
                      auVar18._8_8_ = uVar120;
                      auVar18._0_8_ = uVar117;
                      auVar74 = auVar59 & auVar18 |
                                ~auVar59 & *(undefined1 (*) [16])((long)*palVar34 + lVar55);
                      *(undefined1 (*) [16])((long)*palVar34 + lVar55) = auVar74;
                      auVar20._8_8_ = uVar116;
                      auVar20._0_8_ = uVar111;
                      auVar114 = auVar59 & auVar20 |
                                 ~auVar59 & *(undefined1 (*) [16])((long)*local_288 + lVar55);
                      auVar59 = local_2b8 ^ _DAT_008a1890;
                      auVar124 = local_1f8 ^ _DAT_008a1890;
                      iVar80 = -(uint)(auVar124._0_4_ < auVar59._0_4_);
                      iVar92 = -(uint)(auVar124._4_4_ < auVar59._4_4_);
                      iVar91 = -(uint)(auVar124._8_4_ < auVar59._8_4_);
                      iVar94 = -(uint)(auVar124._12_4_ < auVar59._12_4_);
                      auVar79._4_4_ = -(uint)(auVar124._4_4_ == auVar59._4_4_);
                      auVar79._12_4_ = -(uint)(auVar124._12_4_ == auVar59._12_4_);
                      auVar65._4_4_ = iVar80;
                      auVar65._0_4_ = iVar80;
                      auVar65._8_4_ = iVar91;
                      auVar65._12_4_ = iVar91;
                      auVar79._0_4_ = auVar79._4_4_;
                      auVar79._8_4_ = auVar79._12_4_;
                      auVar66._4_4_ = iVar92;
                      auVar66._0_4_ = iVar92;
                      auVar66._8_4_ = iVar94;
                      auVar66._12_4_ = iVar94;
                      auVar66 = auVar66 | auVar79 & auVar65;
                      local_1f8 = ~auVar66 & local_1f8 | local_2b8 & auVar66;
                      *(undefined1 (*) [16])((long)*local_288 + lVar55) = auVar114;
                      local_2d8._8_8_ = local_2d8._8_8_ - uStack_c0;
                      local_2d8._0_8_ = local_2d8._0_8_ - uVar58;
                      a_06[1] = uVar46;
                      a_06[0] = (longlong)palVar47;
                      b_10[1] = uVar40;
                      alVar128 = _mm_cmpgt_epi64_rpl(a_06,b_10);
                      b_11[0] = alVar128[1];
                      a_07[1] = uVar46;
                      a_07[0] = (longlong)palVar47;
                      b_11[1] = uVar40;
                      alVar128 = _mm_cmpeq_epi64_rpl(a_07,b_11);
                      b_12[0] = alVar128[1];
                      a_08[1] = uVar46;
                      a_08[0] = (longlong)palVar47;
                      b_12[1] = uVar40;
                      alVar128 = _mm_cmpgt_epi64_rpl(a_08,b_12);
                      b_13[0] = alVar128[1];
                      auVar23._8_8_ = extraout_XMM0_Qb_05;
                      auVar23._0_8_ = extraout_XMM0_Qa_05;
                      auVar67._8_8_ = extraout_XMM0_Qb_04;
                      auVar67._0_8_ = extraout_XMM0_Qa_04;
                      auVar67 = extraout_XMM0_01 & auVar23 | auVar67;
                      if ((((((((((((((((auVar67 >> 7 & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0 &&
                                       (auVar67 >> 0xf & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar67 >> 0x17 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                     (auVar67 >> 0x1f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar67 >> 0x27 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar67 >> 0x2f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar67 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar67 >> 0x3f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar67 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar67 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar67 >> 0x57 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar67 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar67 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar67 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar67 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar67[0xf]) goto LAB_0054036d;
                      a_09[1] = uVar46;
                      a_09[0] = (longlong)palVar47;
                      b_13[1] = uVar40;
                      alVar128 = _mm_cmpgt_epi64_rpl(a_09,b_13);
                      b_13[0] = alVar128[1];
                      local_128 = auVar72._0_8_;
                      uStack_120 = auVar72._8_8_;
                      local_1a8 = auVar74._0_8_;
                      uStack_1a0 = auVar74._8_8_;
                      auVar101._8_4_ = 0xffffffff;
                      auVar101._0_8_ = 0xffffffffffffffff;
                      auVar101._12_4_ = 0xffffffff;
                      local_258._0_8_ = auVar114._0_8_;
                      local_258._8_8_ = auVar114._8_8_;
                      uVar115 = uStack_120 & extraout_XMM0_Qb_06 | ~extraout_XMM0_Qb_06 & uVar115;
                      uVar117 = local_1a8 & extraout_XMM0_Qa_06 | ~extraout_XMM0_Qa_06 & uVar117;
                      uVar120 = uStack_1a0 & extraout_XMM0_Qb_06 | ~extraout_XMM0_Qb_06 & uVar120;
                      uVar116 = local_258._8_8_ - auVar101._8_8_ & extraout_XMM0_Qb_06 |
                                ~extraout_XMM0_Qb_06 & uVar116 - auVar101._8_8_;
                      uVar102 = local_258._0_8_ + 1 & extraout_XMM0_Qa_06 |
                                ~extraout_XMM0_Qa_06 & uVar111 + 1;
                      uVar106 = local_128 & extraout_XMM0_Qa_06 | ~extraout_XMM0_Qa_06 & uVar106;
                    }
                    uVar120 = uVar117;
                  }
LAB_0054036d:
                  a_10[1] = uVar46;
                  a_10[0] = (longlong)palVar47;
                  b_14[1] = uVar40;
                  b_14[0] = (longlong)b_13[0];
                  alVar128 = _mm_cmpgt_epi64_rpl(a_10,b_14);
                  lVar55 = alVar128[1];
                  local_268 = palVar38;
                  local_2a8 = local_278;
                  local_2c0 = local_270;
                  local_2a0 = local_280;
                  if ((((((((((((((((extraout_XMM0_02 >> 7 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0 ||
                                   (extraout_XMM0_02 >> 0xf & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (extraout_XMM0_02 >> 0x17 & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0) ||
                                 (extraout_XMM0_02 >> 0x1f & (undefined1  [16])0x1) !=
                                 (undefined1  [16])0x0) ||
                                (extraout_XMM0_02 >> 0x27 & (undefined1  [16])0x1) !=
                                (undefined1  [16])0x0) ||
                               (extraout_XMM0_02 >> 0x2f & (undefined1  [16])0x1) !=
                               (undefined1  [16])0x0) ||
                              (extraout_XMM0_02 >> 0x37 & (undefined1  [16])0x1) !=
                              (undefined1  [16])0x0) ||
                             (extraout_XMM0_02 >> 0x3f & (undefined1  [16])0x1) !=
                             (undefined1  [16])0x0) ||
                            (extraout_XMM0_02 >> 0x47 & (undefined1  [16])0x1) !=
                            (undefined1  [16])0x0) ||
                           (extraout_XMM0_02 >> 0x4f & (undefined1  [16])0x1) !=
                           (undefined1  [16])0x0) ||
                          (extraout_XMM0_02 >> 0x57 & (undefined1  [16])0x1) !=
                          (undefined1  [16])0x0) ||
                         (extraout_XMM0_02 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                         ) || (extraout_XMM0_02 >> 0x67 & (undefined1  [16])0x1) !=
                              (undefined1  [16])0x0) ||
                       (extraout_XMM0_02 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                      || (extraout_XMM0_02 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                      ) || extraout_XMM0_02[0xf] < '\0') {
                    lVar55 = local_1f8._8_8_;
                    if ((long)local_1f8._8_8_ < (long)local_1f8._0_8_) {
                      lVar55 = local_1f8._0_8_;
                    }
                    local_160 = lVar55;
                    if ((long)(~(long)iVar31 + 0x7fffffffffffffffU) < lVar55) {
                      *(byte *)&result_00->flag = (byte)result_00->flag | 0x40;
                      local_2d8._0_8_ = local_298;
                      local_280 = palVar34;
                      local_278 = palVar33;
                      local_270 = palVar32;
                      goto LAB_005404e9;
                    }
                    uVar53 = local_230 & 0xffffffff;
                  }
                  local_2d8._0_8_ = local_298;
                  local_298 = local_288;
                }
                local_230 = (ulong)(iVar6 + 1U);
                local_288 = local_298;
                s2 = (char *)local_298;
LAB_005404e9:
                palVar32 = local_280;
                palVar34 = local_288;
                palVar33 = local_2a0;
                uVar25 = local_2d8._0_8_;
                if ((local_160 == 0x7fffffffffffffff) ||
                   (a_11[1] = uVar46, a_11[0] = (longlong)palVar47, b_15[1] = (longlong)s2,
                   b_15[0] = lVar55, _mm_cmpeq_epi64_rpl(a_11,b_15),
                   (((((((((((((((extraout_XMM0_03 >> 7 & (undefined1  [16])0x1) !=
                                 (undefined1  [16])0x0 ||
                                (extraout_XMM0_03 >> 0xf & (undefined1  [16])0x1) !=
                                (undefined1  [16])0x0) ||
                               (extraout_XMM0_03 >> 0x17 & (undefined1  [16])0x1) !=
                               (undefined1  [16])0x0) ||
                              (extraout_XMM0_03 >> 0x1f & (undefined1  [16])0x1) !=
                              (undefined1  [16])0x0) ||
                             (extraout_XMM0_03 >> 0x27 & (undefined1  [16])0x1) !=
                             (undefined1  [16])0x0) ||
                            (extraout_XMM0_03 >> 0x2f & (undefined1  [16])0x1) !=
                            (undefined1  [16])0x0) ||
                           (extraout_XMM0_03 >> 0x37 & (undefined1  [16])0x1) !=
                           (undefined1  [16])0x0) ||
                          (extraout_XMM0_03 >> 0x3f & (undefined1  [16])0x1) !=
                          (undefined1  [16])0x0) ||
                         (extraout_XMM0_03 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                         ) || (extraout_XMM0_03 >> 0x4f & (undefined1  [16])0x1) !=
                              (undefined1  [16])0x0) ||
                       (extraout_XMM0_03 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                      || (extraout_XMM0_03 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                      ) || (extraout_XMM0_03 >> 0x67 & (undefined1  [16])0x1) !=
                           (undefined1  [16])0x0) ||
                    (extraout_XMM0_03 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (extraout_XMM0_03 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   extraout_XMM0_03[0xf] < '\0')) {
                  *(byte *)&result_00->flag = (byte)result_00->flag | 0x40;
                }
                iVar31 = parasail_result_is_saturated(result_00);
                iVar30 = 0;
                palVar47 = palVar36;
                palVar38 = palVar35;
                if (iVar31 == 0) {
                  palVar51 = local_2c0;
                  if (iVar45 == (int)local_230 + -1) {
                    local_288 = local_268;
                    local_280 = local_228;
                    local_228 = palVar32;
                    palVar47 = local_278;
                    palVar38 = local_270;
                    local_278 = palVar36;
                    local_270 = palVar35;
                    local_268 = palVar34;
                  }
                  else if (iVar45 == (int)local_230 + -2) {
                    local_2d8._0_8_ = local_268;
                    local_2a0 = local_228;
                    local_228 = palVar33;
                    palVar47 = local_2a8;
                    local_2a8 = palVar36;
                    palVar51 = palVar35;
                    palVar38 = local_2c0;
                    local_268 = (__m128i *)uVar25;
                  }
                  uVar52 = 0;
                  lVar50 = 0;
                  lVar42 = 0;
                  lVar48 = 0;
                  while( true ) {
                    iVar31 = (int)lVar48;
                    iVar80 = (int)uVar39;
                    if ((uVar11 & 0x3fffffff) * 2 == (int)uVar52) break;
                    if ((*palVar38)[uVar52] == local_160) {
                      uVar49 = 0;
                      if ((uVar52 & 1) != 0) {
                        uVar49 = uVar11;
                      }
                      uVar49 = uVar49 + ((uint)(uVar52 >> 1) & 0x7fffffff);
                      if ((int)uVar49 < iVar80) {
                        lVar48 = (*palVar47)[uVar52];
                        lVar50 = (*local_228)[uVar52];
                        lVar42 = (*local_268)[uVar52];
                        uVar39 = (ulong)uVar49;
                      }
                    }
                    uVar52 = uVar52 + 1;
                  }
                  iVar30 = (int)lVar50;
                  iVar92 = (int)lVar42;
                  local_2c0 = palVar51;
                }
                else {
                  iVar92 = 0;
                  iVar31 = 0;
                  local_160 = 0;
                  iVar45 = 0;
                  iVar80 = 0;
                }
                result_00->score = (int)local_160;
                result_00->end_query = iVar80;
                result_00->end_ref = iVar45;
                ((result_00->field_4).stats)->matches = iVar31;
                ((result_00->field_4).stats)->similar = iVar30;
                ((result_00->field_4).stats)->length = iVar92;
                parasail_free(local_268);
                parasail_free(local_228);
                parasail_free(palVar47);
                parasail_free(palVar38);
                parasail_free(b_02);
                parasail_free(b_01);
                parasail_free(b_00);
                parasail_free(b);
                parasail_free((void *)local_2d8._0_8_);
                parasail_free(local_288);
                parasail_free(local_2a0);
                parasail_free(local_280);
                parasail_free(local_2a8);
                parasail_free(local_278);
                parasail_free(local_2c0);
                parasail_free(local_270);
              }
              else {
                result_00 = (parasail_result_t *)0x0;
              }
            }
            goto LAB_00540853;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar41 = "gap";
        }
      }
    }
  }
  result_00 = (parasail_result_t *)0x0;
  fprintf(_stderr,__format,"parasail_sw_stats_striped_profile_sse2_128_64_internal",pcVar41);
LAB_00540853:
  parasail_profile_free(profile_00);
  parasail_result_free(result);
  result_00->end_query = iVar29;
  result_00->end_ref = iVar6;
  return result_00;
}

Assistant:

parasail_result_t* INAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    const char *s1 = profile->s1;
    const parasail_matrix_t *matrix = profile->matrix;

    /* find the end loc first with the faster implementation */
    parasail_result_t *result = parasail_sw_striped_profile_sse2_128_64(profile, s2, s2Len, open, gap);
    if (!parasail_result_is_saturated(result)) {
#if 0
        int s1Len_new = 0;
        int s2Len_new = 0;
        char *s1_new = NULL;
        char *s2_new = NULL;
        parasail_profile_t *profile_new = NULL;
        parasail_result_t *result_new = NULL;
        int s1_begin = 0;
        int s2_begin = 0;
        int s1Len_final = 0;
        int s2Len_final = 0;
        parasail_profile_t *profile_final = NULL;
        parasail_result_t *result_final = NULL;

        /* using the end loc and the non-stats version of the function,
         * reverse the inputs and find the beg loc */
        s1Len_new = result->end_query+1;
        s2Len_new = result->end_ref+1;
        s1_new = parasail_reverse(s1, s1Len_new);
        s2_new = parasail_reverse(s2, s2Len_new);
        profile_new = parasail_profile_create_sse_128_64(
                s1_new, s1Len_new, matrix);
        profile_new->stop = result->score;
        result_new = parasail_sw_striped_profile_sse2_128_64(
                profile_new, s2_new, s2Len_new, open, gap);

        /* using both the beg and end loc, call the original stats func */
        s1_begin = s1Len_new - result_new->end_query - 1;
        s2_begin = s2Len_new - result_new->end_ref - 1;
        s1Len_final = s1Len_new - s1_begin;
        s2Len_final = s2Len_new - s2_begin;
        assert(s1_begin >= 0);
        assert(s2_begin >= 0);
        assert(s1Len_new > s1_begin);
        assert(s2Len_new > s2_begin);
        profile_final = parasail_profile_create_stats_sse_128_64(
                &s1[s1_begin], s1Len_final, matrix);
        result_final = PNAME(
                profile_final, &s2[s2_begin], s2Len_final, open, gap);

        /* clean up all the temporary profiles, sequences, and results */
        free(s1_new);
        free(s2_new);
        parasail_profile_free(profile_new);
        parasail_profile_free(profile_final);
        parasail_result_free(result);
        parasail_result_free(result_new);

        /* correct the end locations before returning */
        result_final->end_query = s1Len_new-1;
        result_final->end_ref = s2Len_new-1;
        return result_final;
#else
        int s1Len_new = 0;
        int s2Len_new = 0;
        parasail_profile_t *profile_final = NULL;
        parasail_result_t *result_final = NULL;

        /* using the end loc, call the original stats function */
        s1Len_new = result->end_query+1;
        s2Len_new = result->end_ref+1;
        profile_final = parasail_profile_create_stats_sse_128_64(
                s1, s1Len_new, matrix);
        result_final = PNAME(
                profile_final, s2, s2Len_new, open, gap);

        /* clean up all the temporary profiles, sequences, and results */
        parasail_profile_free(profile_final);
        parasail_result_free(result);

        /* correct the end locations before returning */
        result_final->end_query = s1Len_new-1;
        result_final->end_ref = s2Len_new-1;
        return result_final;
#endif
    }
    else {
        return result;
    }
}